

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void generate_stats(int *st,int *spent,int *inc,int *left)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  wchar_t local_50;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t next_stat;
  wchar_t points_trigger;
  wchar_t dex_break;
  wchar_t blows;
  _Bool warrior;
  _Bool caster;
  wchar_t spell_stat;
  undefined1 auStack_2c [3];
  _Bool maxed [5];
  wchar_t step;
  int *left_local;
  int *inc_local;
  int *spent_local;
  int *st_local;
  
  _auStack_2c = 0;
  unique0x10000347 = left;
  memset(&caster,0,5);
  if ((player->class->magic).total_spells == 0) {
    local_50 = L'\0';
  }
  else {
    local_50 = ((player->class->magic).books)->realm->stat;
  }
  bVar2 = player->class->max_attacks < 5;
  iVar1 = player->class->max_attacks;
  points_trigger = L'\n';
  next_stat = L'\n';
  do {
    if (*stack0xffffffffffffffd8 == L'\0' || _auStack_2c < 0) {
      event_signal_birthpoints(spent,inc,*stack0xffffffffffffffd8);
      recalculate_stats(st,*stack0xffffffffffffffd8);
      return;
    }
    switch(_auStack_2c) {
    case 0:
      if (((caster & 1U) == 0) && (*st < 0x11)) {
        _Var4 = buy_stat(L'\0',st,spent,inc,stack0xffffffffffffffd8,false);
        if (!_Var4) {
          caster = true;
        }
      }
      else {
        _auStack_2c = _auStack_2c + 1;
        if (bVar2) {
          _auStack_2c = 3;
        }
      }
      break;
    case 1:
      if (((spell_stat._2_1_ & 1) == 0) && (st[3] < 0x11)) {
        _Var4 = buy_stat(L'\x03',st,spent,inc,stack0xffffffffffffffd8,true);
        if (!_Var4) {
          spell_stat._2_1_ = 1;
        }
        if (points_trigger < (player->state).num_blows / 10) {
          points_trigger = (player->state).num_blows / 10;
          next_stat = st[3];
        }
      }
      else {
        _auStack_2c = _auStack_2c + 1;
      }
      break;
    case 2:
      while (next_stat < st[3]) {
        sell_stat(L'\x03',st,spent,inc,stack0xffffffffffffffd8,false);
        spell_stat._2_1_ = 0;
      }
      _auStack_2c = _auStack_2c + 1;
      break;
    case 3:
      local_48 = *stack0xffffffffffffffd8 / 2;
      if (iVar1 < 6) {
        while( true ) {
          bVar3 = false;
          if ((((&caster)[local_50] & 1U) == 0) && ((bVar2 || (bVar3 = false, st[local_50] < 0x12)))
             ) {
            bVar3 = spent[local_50] < local_48;
          }
          if (!bVar3) break;
          _Var4 = buy_stat(local_50,st,spent,inc,stack0xffffffffffffffd8,false);
          if (!_Var4) {
            (&caster)[local_50] = true;
          }
          if (local_48 < spent[local_50]) {
            sell_stat(local_50,st,spent,inc,stack0xffffffffffffffd8,false);
            (&caster)[local_50] = true;
          }
        }
      }
      else {
        local_48 = *stack0xffffffffffffffd8;
      }
      while( true ) {
        bVar3 = false;
        if (((spell_stat._3_1_ & 1) == 0) && (bVar3 = false, st[4] < 0x10)) {
          bVar3 = spent[4] < local_48;
        }
        if (!bVar3) break;
        _Var4 = buy_stat(L'\x04',st,spent,inc,stack0xffffffffffffffd8,false);
        if (!_Var4) {
          spell_stat._3_1_ = 1;
        }
        if (local_48 < spent[4]) {
          sell_stat(L'\x04',st,spent,inc,stack0xffffffffffffffd8,false);
          spell_stat._3_1_ = 1;
        }
      }
      _auStack_2c = _auStack_2c + 1;
      break;
    case 4:
      if ((spell_stat._2_1_ & 1) == 0) {
        local_4c = L'\x03';
      }
      else if ((((byte)spell_stat & 1) == 0) && (local_50 != L'\x01')) {
        local_4c = L'\x01';
      }
      else {
        if (((spell_stat._1_1_ & 1) != 0) || (local_50 == L'\x02')) {
          _auStack_2c = _auStack_2c + 1;
          break;
        }
        local_4c = L'\x02';
      }
      do {
        _Var4 = buy_stat(local_4c,st,spent,inc,stack0xffffffffffffffd8,false);
      } while (_Var4);
      (&caster)[local_4c] = true;
      break;
    default:
      _auStack_2c = -1;
    }
  } while( true );
}

Assistant:

static void generate_stats(int st[STAT_MAX], int spent[STAT_MAX],
		int inc[STAT_MAX], int *left)
{
	int step = 0;
	bool maxed[STAT_MAX] = { 0 };
	/* Hack - for now, just use stat of first book - NRM */
	int spell_stat = player->class->magic.total_spells ?
		player->class->magic.books[0].realm->stat : 0;
	bool caster = player->class->max_attacks < 5 ? true : false;
	bool warrior = player->class->max_attacks > 5 ? true : false;
	int blows = 10;
	int dex_break = 10;

	while (*left && step >= 0) {
	
		switch (step) {
		
			/* Buy base STR 17 */
			case 0: {
			
				if (!maxed[STAT_STR] && st[STAT_STR] < 17) {
					if (!buy_stat(STAT_STR, st, spent, inc,
							left, false))
						maxed[STAT_STR] = true;
				} else {
					step++;
					
					/* If pure caster skip to step 3 */
					if (caster) {
						step = 3;
					}
				}

				break;
			}

			/* Buy base DEX of 17, record best breakpoint */
			case 1: {
				if (!maxed[STAT_DEX] && st[STAT_DEX] < 17) {
					if (!buy_stat(STAT_DEX, st, spent, inc,
							left, true)) {
						maxed[STAT_DEX] = true;
					}
					if (player->state.num_blows / 10 > blows) {
						blows = player->state.num_blows / 10;
						dex_break = st[STAT_DEX];
					}
				} else {
					step++;
				}

				break;
			}

			/* Sell back DEX that isn't getting us an extra blow. */
			case 2: {
				while (st[STAT_DEX] > dex_break) {
					sell_stat(STAT_DEX, st, spent, inc,
						left, false);
					maxed[STAT_DEX] = false;
				}
				step++;
				break;
			}

			/* 
			 * Spend up to half remaining points on each of spell-stat and 
			 * con, but only up to max base of 16 unless a pure class 
			 * [caster or warrior]
			 */
			case 3: 
			{
				int points_trigger = *left / 2;
				
				if (warrior) {
					points_trigger = *left;
				} else {
					while (!maxed[spell_stat] &&
						   (caster || st[spell_stat] < 18) &&
						   spent[spell_stat] < points_trigger) {

						if (!buy_stat(spell_stat, st,
								spent, inc,
								left, false)) {
							maxed[spell_stat] = true;
						}

						if (spent[spell_stat] > points_trigger) {
						
							sell_stat(spell_stat,
								st, spent, inc,
								left, false);
							maxed[spell_stat] = true;
						}
					}
				}

				while (!maxed[STAT_CON] &&
					   st[STAT_CON] < 16 &&
					   spent[STAT_CON] < points_trigger) {
					   
					if (!buy_stat(STAT_CON, st, spent, inc,
							left, false)) {
						maxed[STAT_CON] = true;
					}

					if (spent[STAT_CON] > points_trigger) {
						sell_stat(STAT_CON, st, spent,
							inc, left, false);
						maxed[STAT_CON] = true;
					}
				}
				
				step++;
				break;
			}

			/* 
			 * If there are any points left, spend as much as possible in 
			 * order on DEX, and the non-spell-stat. 
			 */
			case 4:{
			
				int next_stat;

				if (!maxed[STAT_DEX]) {
					next_stat = STAT_DEX;
				} else if (!maxed[STAT_INT] && spell_stat != STAT_INT) {
					next_stat = STAT_INT;
				} else if (!maxed[STAT_WIS] && spell_stat != STAT_WIS) {
					next_stat = STAT_WIS;
				} else {
					step++;
					break;
				}

				/* Buy until we can't buy any more. */
				while (buy_stat(next_stat, st, spent, inc, left,
						false));
				maxed[next_stat] = true;

				break;
			}

			default: {
			
				step = -1;
				break;
			}
		}
	}
	/* Tell the UI the new points situation. */
	event_signal_birthpoints(spent, inc, *left);

	/* Recalculate everything that's changed because
	   the stat has changed, and inform the UI. */
	recalculate_stats(st, *left);
}